

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O2

void cfg_help_netaddr(autobuf *out,_Bool preamble,_Bool prefix,int8_t *af_types,
                     size_t af_types_count)

{
  char cVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  char *s;
  size_t sVar3;
  
  if ((int)CONCAT71(in_register_00000031,preamble) != 0) {
    abuf_puts(out,"    Parameter must be an address of the following type: ");
  }
  bVar2 = true;
  for (sVar3 = 0; af_types_count != sVar3; sVar3 = sVar3 + 1) {
    cVar1 = af_types[sVar3];
    if (cVar1 != -1) {
      if (!bVar2) {
        abuf_puts(out,", ");
      }
      s = "IPv4";
      if (cVar1 != '\x02') {
        if (cVar1 == '0') {
          s = "EUI64";
        }
        else if (cVar1 == '/') {
          s = "MAC48";
        }
        else if (cVar1 == '\n') {
          s = "IPv6";
        }
        else {
          s = "Unspec (-)";
        }
      }
      abuf_puts(out,s);
      bVar2 = false;
    }
  }
  if (prefix) {
    abuf_puts(out,"\n        (the address can have an optional prefix)");
  }
  abuf_puts(out,"\n");
  return;
}

Assistant:

void
cfg_help_netaddr(struct autobuf *out, bool preamble, bool prefix, const int8_t *af_types, size_t af_types_count) {
  int8_t type;
  bool first;
  size_t i;

  if (preamble) {
    abuf_puts(out, CFG_HELP_INDENT_PREFIX "Parameter must be an address of the following type: ");
  }

  first = true;
  for (i = 0; i < af_types_count; i++) {
    type = af_types[i];

    if (type == -1) {
      continue;
    }

    if (first) {
      first = false;
    }
    else {
      abuf_puts(out, ", ");
    }

    switch (type) {
      case AF_INET:
        abuf_puts(out, "IPv4");
        break;
      case AF_INET6:
        abuf_puts(out, "IPv6");
        break;
      case AF_MAC48:
        abuf_puts(out, "MAC48");
        break;
      case AF_EUI64:
        abuf_puts(out, "EUI64");
        break;
      default:
        abuf_puts(out, "Unspec (-)");
        break;
    }
  }

  if (prefix) {
    abuf_puts(out, "\n" CFG_HELP_INDENT_PREFIX "    (the address can have an optional prefix)");
  }
  abuf_puts(out, "\n");
}